

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool item_tester_uncursable(object *obj)

{
  curse_data *pcVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  
  pcVar1 = obj->known->curses;
  if ((pcVar1 != (curse_data *)0x0) && (1 < (ulong)z_info->curse_max)) {
    lVar2 = 0;
    do {
      bVar3 = (uint)(pcVar1[lVar2 + 1].power + L'\xffffffff') < 99;
      if (bVar3) {
        return bVar3;
      }
      bVar4 = (ulong)z_info->curse_max - 2 != lVar2;
      lVar2 = lVar2 + 1;
    } while (bVar4);
    return bVar3;
  }
  return false;
}

Assistant:

static bool item_tester_uncursable(const struct object *obj)
{
	struct curse_data *c = obj->known->curses;
	if (c) {
		size_t i;
		for (i = 1; i < z_info->curse_max; i++) {
			if (c[i].power > 0 && c[i].power < 100) {
				return true;
			}
		}
	}
	return false;
}